

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

bool uWS::protocol::isValidUtf8(uchar *s,size_t length)

{
  byte in_CL;
  uint *puVar1;
  long lVar2;
  uint *puVar3;
  bool bVar4;
  
  bVar4 = length == 0;
  if (!bVar4) {
    puVar1 = (uint *)(s + length);
    do {
      puVar3 = (uint *)((long)s + 4);
      if ((puVar1 < puVar3) || ((*(uint *)s & 0x80808080) != 0)) {
        lVar2 = (long)s + 2;
        goto LAB_00132ce8;
      }
      bVar4 = puVar3 == puVar1;
      s = (uchar *)puVar3;
    } while (!bVar4);
LAB_00132e46:
    in_CL = 0;
  }
  goto LAB_00132e4e;
  while (puVar3 = (uint *)(lVar2 + -1), lVar2 = lVar2 + 1, puVar3 != puVar1) {
LAB_00132ce8:
    if ((char)*(byte *)(lVar2 + -2) < '\0') {
      if (((*(byte *)(lVar2 + -2) & 0x60) != 0x40) || (puVar1 <= (uint *)(lVar2 - 1U)))
      goto LAB_00132e46;
      in_CL = 0;
      goto LAB_00132e4e;
    }
  }
  in_CL = 1;
LAB_00132e4e:
  return (bool)(bVar4 | in_CL & 1);
}

Assistant:

static bool isValidUtf8(unsigned char *s, size_t length)
{
    for (unsigned char *e = s + length; s != e; ) {
        if (s + 4 <= e) {
            uint32_t tmp;
            memcpy(&tmp, s, 4);
            if ((tmp & 0x80808080) == 0) {
                s += 4;
                continue;
            }
        }

        while (!(*s & 0x80)) {
            if (++s == e) {
                return true;
            }
        }

        if ((s[0] & 0x60) == 0x40) {
            if (s + 1 >= e || (s[1] & 0xc0) != 0x80 || (s[0] & 0xfe) == 0xc0) {
                return false;
            }
            s += 2;
        } else if ((s[0] & 0xf0) == 0xe0) {
            if (s + 2 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
                    (s[0] == 0xe0 && (s[1] & 0xe0) == 0x80) || (s[0] == 0xed && (s[1] & 0xe0) == 0xa0)) {
                return false;
            }
            s += 3;
        } else if ((s[0] & 0xf8) == 0xf0) {
            if (s + 3 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 || (s[3] & 0xc0) != 0x80 ||
                    (s[0] == 0xf0 && (s[1] & 0xf0) == 0x80) || (s[0] == 0xf4 && s[1] > 0x8f) || s[0] > 0xf4) {
                return false;
            }
            s += 4;
        } else {
            return false;
        }
    }
    return true;
}